

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void __thiscall
LinearGE<0,_1>::LinearGE(LinearGE<0,_1> *this,vec<int> *a,vec<IntVar_*> *_x,int _c,BoolView *_r)

{
  int *piVar1;
  uint i;
  ulong uVar2;
  undefined8 uStack_70;
  IntView<0> local_60;
  vec<IntView<1>_> *local_50;
  vec<Lit> *local_48;
  vec<int> *local_40;
  BoolView *local_38;
  
  Propagator::Propagator(&this->super_Propagator);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__LinearGE_001f23b0;
  local_40 = &this->pos;
  vec<int>::vec(local_40,_x->sz);
  (this->y).sz = 0;
  (this->y).cap = 0;
  (this->y).data = (IntView<1> *)0x0;
  (this->x).sz = 0;
  (this->x).cap = 0;
  (this->x).data = (IntView<0> *)0x0;
  this->c = _c;
  (this->r).super_Var.super_Branching._vptr_Branching = (_func_int **)&PTR_finished_001efbb8;
  (this->r).v = _r->v;
  (this->r).s = _r->s;
  this->fix = 0;
  this->fix_x = 0;
  this->fix_y = 0;
  local_50 = &this->y;
  this->fix_sum = (long)-_c;
  local_48 = &this->ps;
  vec<Lit>::vec(local_48,_x->sz + 1);
  local_38 = &this->r;
  (this->super_Propagator).priority = 2;
  for (uVar2 = 0; uVar2 < _x->sz; uVar2 = uVar2 + 1) {
    piVar1 = a->data;
    if (piVar1[uVar2] < 1) {
      (this->pos).data[uVar2] = ~(this->y).sz;
      local_60.var = _x->data[uVar2];
      local_60.a = -piVar1[uVar2];
      local_60.b = 0;
      vec<IntView<1>_>::push(local_50,(IntView<1> *)&local_60);
      uStack_70 = 2;
    }
    else {
      (this->pos).data[uVar2] = (this->x).sz;
      local_60.var = _x->data[uVar2];
      local_60.a = piVar1[uVar2];
      local_60.b = 0;
      vec<IntView<0>_>::push(&this->x,&local_60);
      uStack_70 = 4;
    }
    (*(_x->data[uVar2]->super_Var).super_Branching._vptr_Branching[7])
              (_x->data[uVar2],this,uVar2 & 0xffffffff,uStack_70);
  }
  BoolView::attach(local_38,&this->super_Propagator,_x->sz,2);
  return;
}

Assistant:

LinearGE(vec<int>& a, vec<IntVar*>& _x, int _c, BoolView _r = bv_true)
			: pos(_x.size()),
				c(_c),
				r(std::move(_r)),

				fix_sum(-c),
				ps(R + _x.size()) {
		priority = 2;

		for (unsigned int i = 0; i < _x.size(); i++) {
			assert(a[i]);
			if (a[i] > 0) {
				pos[i] = x.size();
				x.push(IntView<2 * S>(_x[i], a[i]));
				_x[i]->attach(this, i, EVENT_U);
			} else {
				pos[i] = -static_cast<int>(y.size()) - 1;
				y.push(IntView<2 * S + 1>(_x[i], -a[i]));
				_x[i]->attach(this, i, EVENT_L);
			}
		}
		if (R != 0) {
			r.attach(this, _x.size(), EVENT_L);
		}
	}